

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

void frames_write_at(FrameArray *frame_arr,uint32_t index,CallFrame *frame)

{
  CallFrame **ppCVar1;
  ulong uVar2;
  
  if (index <= frame_arr->cap) {
    if (frame_arr->cap == index) {
      uVar2 = 8;
      if (7 < index) {
        uVar2 = (ulong)(index * 2);
      }
      frame_arr->cap = (uint32_t)uVar2;
      ppCVar1 = (CallFrame **)reallocate(frame_arr->frame_pointers,uVar2 << 3);
      frame_arr->frame_pointers = ppCVar1;
    }
    if (frame_arr->count <= index) {
      frame_arr->count = frame_arr->count + 1;
    }
    frame_arr->frame_pointers[index] = frame;
    return;
  }
  fwrite("Invalid write in frame array",0x1c,1,_stderr);
  exit(100);
}

Assistant:

void frames_write_at(FrameArray *frame_arr, uint32_t index, CallFrame *frame) {
    if (index > frame_arr->cap) {
        fprintf(stderr, "Invalid write in frame array");
        exit(100);
    }

    if (index == frame_arr->cap) {
        frame_arr->cap = GROW_CAP(frame_arr->cap);
        frame_arr->frame_pointers = GROW_ARR(frame_arr->frame_pointers, CallFrame *, frame_arr->cap);
    }

    if (index >= frame_arr->count) {
        ++frame_arr->count;
    }

    frame_arr->frame_pointers[index] = frame;
}